

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WhereExplainBloomFilter(Parse *pParse,WhereInfo *pWInfo,WhereLevel *pLevel)

{
  byte bVar1;
  long lVar2;
  SrcList *pSVar3;
  Vdbe *p;
  WhereLoop *pWVar4;
  Table *pTVar5;
  char *pcVar6;
  long lVar7;
  uint i;
  long in_FS_OFFSET;
  StrAccum local_c8;
  char zBuf [100];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar3 = pWInfo->pTabList;
  bVar1 = pLevel->iFrom;
  local_c8.db = pParse->db;
  p = pParse->pVdbe;
  local_c8.zText = zBuf;
  local_c8.nAlloc = 100;
  local_c8.mxAlloc = 1000000000;
  local_c8.nChar = 0;
  local_c8.accError = '\0';
  local_c8.printfFlags = '\x01';
  sqlite3_str_appendf(&local_c8,"BLOOM FILTER ON %S (",pSVar3->a + bVar1);
  pWVar4 = pLevel->pWLoop;
  if ((pWVar4->wsFlags & 0x100) == 0) {
    for (i = (uint)pWVar4->nSkip; i < (pWVar4->u).btree.nEq; i = i + 1) {
      pcVar6 = explainIndexColumnName((pWVar4->u).btree.pIndex,i);
      if (pWVar4->nSkip < i) {
        sqlite3_str_append(&local_c8," AND ",5);
      }
      sqlite3_str_appendf(&local_c8,"%s=?",pcVar6);
    }
  }
  else {
    pTVar5 = pSVar3->a[bVar1].pTab;
    lVar7 = (long)pTVar5->iPKey;
    if (lVar7 < 0) {
      sqlite3_str_appendf(&local_c8,"rowid=?");
    }
    else {
      sqlite3_str_appendf(&local_c8,"%s=?",pTVar5->aCol[lVar7].zCnName);
    }
  }
  sqlite3_str_append(&local_c8,")",1);
  pcVar6 = sqlite3StrAccumFinish(&local_c8);
  sqlite3VdbeAddOp4(p,0xb9,p->nOp,pParse->addrExplain,0,pcVar6,-6);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3WhereExplainBloomFilter(
  const Parse *pParse,               /* Parse context */
  const WhereInfo *pWInfo,           /* WHERE clause */
  const WhereLevel *pLevel           /* Bloom filter on this level */
){
  int ret = 0;
  SrcItem *pItem = &pWInfo->pTabList->a[pLevel->iFrom];
  Vdbe *v = pParse->pVdbe;      /* VM being constructed */
  sqlite3 *db = pParse->db;     /* Database handle */
  char *zMsg;                   /* Text to add to EQP output */
  int i;                        /* Loop counter */
  WhereLoop *pLoop;             /* The where loop */
  StrAccum str;                 /* EQP output string */
  char zBuf[100];               /* Initial space for EQP output string */

  sqlite3StrAccumInit(&str, db, zBuf, sizeof(zBuf), SQLITE_MAX_LENGTH);
  str.printfFlags = SQLITE_PRINTF_INTERNAL;
  sqlite3_str_appendf(&str, "BLOOM FILTER ON %S (", pItem);
  pLoop = pLevel->pWLoop;
  if( pLoop->wsFlags & WHERE_IPK ){
    const Table *pTab = pItem->pTab;
    if( pTab->iPKey>=0 ){
      sqlite3_str_appendf(&str, "%s=?", pTab->aCol[pTab->iPKey].zCnName);
    }else{
      sqlite3_str_appendf(&str, "rowid=?");
    }
  }else{
    for(i=pLoop->nSkip; i<pLoop->u.btree.nEq; i++){
      const char *z = explainIndexColumnName(pLoop->u.btree.pIndex, i);
      if( i>pLoop->nSkip ) sqlite3_str_append(&str, " AND ", 5);
      sqlite3_str_appendf(&str, "%s=?", z);
    }
  }
  sqlite3_str_append(&str, ")", 1);
  zMsg = sqlite3StrAccumFinish(&str);
  ret = sqlite3VdbeAddOp4(v, OP_Explain, sqlite3VdbeCurrentAddr(v),
                          pParse->addrExplain, 0, zMsg,P4_DYNAMIC);

  sqlite3VdbeScanStatus(v, sqlite3VdbeCurrentAddr(v)-1, 0, 0, 0, 0);
  return ret;
}